

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chip8.cpp
# Opt level: O0

void __thiscall Chip8::OP_8XY6(Chip8 *this)

{
  ostream *poVar1;
  Chip8 *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"SHR V");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->opcode & 0xf00) >> 8);
  poVar1 = std::operator<<(poVar1,"{, V");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->opcode & 0xf0) >> 4);
  poVar1 = std::operator<<(poVar1,"}                 ; Set Vx = Vx SHR 1");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Chip8::OP_8XY6() {
    std::cout << "SHR V"<<((opcode & 0x0F00u) >> 8u) << "{, V"<<((opcode & 0x00F0u) >> 4u)<< "}                 ; Set Vx = Vx SHR 1" << std::endl;
}